

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptArray::BigIndex::SetItem
          (BigIndex *this,RecyclableObject *obj,Var newValue,PropertyOperationFlags flags)

{
  Var object;
  bool bVar1;
  PropertyId propertyId;
  PropertyRecord *local_40;
  PropertyRecord *propertyRecord;
  ScriptContext *scriptContext;
  Var pvStack_28;
  PropertyOperationFlags flags_local;
  Var newValue_local;
  RecyclableObject *obj_local;
  BigIndex *this_local;
  
  scriptContext._4_4_ = flags;
  pvStack_28 = newValue;
  newValue_local = obj;
  obj_local = (RecyclableObject *)this;
  bVar1 = IsSmallIndex(this);
  if (bVar1) {
    this_local._4_4_ =
         IndexTrace<unsigned_int>::SetItem
                   ((RecyclableObject *)newValue_local,&this->index,pvStack_28,scriptContext._4_4_);
  }
  else {
    propertyRecord =
         (PropertyRecord *)RecyclableObject::GetScriptContext((RecyclableObject *)newValue_local);
    Js::JavascriptOperators::GetPropertyIdForInt
              (this->bigIndex,(ScriptContext *)propertyRecord,&local_40);
    object = newValue_local;
    propertyId = PropertyRecord::GetPropertyId(local_40);
    this_local._4_4_ =
         Js::JavascriptOperators::SetProperty
                   (object,(RecyclableObject *)object,propertyId,pvStack_28,
                    (ScriptContext *)propertyRecord,scriptContext._4_4_);
  }
  return this_local._4_4_;
}

Assistant:

BOOL JavascriptArray::BigIndex::SetItem(RecyclableObject* obj, Var newValue, PropertyOperationFlags flags) const
    {
        if (IsSmallIndex())
        {
            return small_index::SetItem(obj, index, newValue, flags);
        }
        else
        {
            ScriptContext* scriptContext = obj->GetScriptContext();
            PropertyRecord const * propertyRecord;
            JavascriptOperators::GetPropertyIdForInt(bigIndex, scriptContext, &propertyRecord);
            return JavascriptOperators::SetProperty(obj, obj, propertyRecord->GetPropertyId(), newValue, scriptContext, flags);
        }
    }